

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

void __thiscall
capnp::compiler::CompilerMain::addGlobalOptions(CompilerMain *this,MainBuilder *builder)

{
  StringPtr helpText;
  Iface *pIVar1;
  Iface *pIVar2;
  MainBuilder *this_00;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  StringPtr argumentTitle;
  StringPtr helpText_00;
  Function<kj::MainBuilder::Validity_()> local_78;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_68;
  OptionName local_58;
  char *local_48;
  undefined8 uStack_40;
  OptionName local_38;
  undefined1 local_28;
  char *local_20;
  
  local_38.isLong = false;
  local_38.field_1.shortName = 'I';
  local_28 = 1;
  local_20 = "import-path";
  local_68.impl.ptr = (Iface *)operator_new(0x18);
  (local_68.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002bb380;
  local_68.impl.ptr[1]._vptr_Iface = (_func_int **)this;
  local_68.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::{lambda(auto:1&,(auto:2&&)...)#1},capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::{lambda(auto:1&,(auto:2&&)...)#2}>>>
        ::instance;
  local_48 = 
  "Add <dir> to the list of directories searched for non-relative imports (ones that start with a \'/\')."
  ;
  uStack_40 = 0x65;
  helpText.content.size_ = 0x65;
  helpText.content.ptr =
       "Add <dir> to the list of directories searched for non-relative imports (ones that start with a \'/\')."
  ;
  names._M_len = 2;
  names._M_array = &local_38;
  argumentTitle.content.size_ = 6;
  argumentTitle.content.ptr = "<dir>";
  this_00 = kj::MainBuilder::addOptionWithArg(builder,names,&local_68,argumentTitle,helpText);
  local_58.isLong = true;
  local_58.field_1.longName = "no-standard-import";
  local_78.impl.ptr = (Iface *)operator_new(0x18);
  (local_78.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002bb3f8;
  local_78.impl.ptr[1]._vptr_Iface = (_func_int **)this;
  local_78.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::{lambda(auto:1&,(auto:2&&)...)#3},capnp::compiler::CompilerMain::addGlobalOptions(kj::MainBuilder&)::{lambda(auto:1&,(auto:2&&)...)#4}>>>
        ::instance;
  names_00._M_len = 1;
  names_00._M_array = &local_58;
  helpText_00.content.size_ = 0x95;
  helpText_00.content.ptr =
       "Do not add any default import paths; use only those specified by -I.  Otherwise, typically /usr/include and /usr/local/include are added by default."
  ;
  kj::MainBuilder::addOption(this_00,names_00,&local_78,helpText_00);
  pIVar1 = local_78.impl.ptr;
  if (local_78.impl.ptr != (Iface *)0x0) {
    local_78.impl.ptr = (Iface *)0x0;
    (**(local_78.impl.disposer)->_vptr_Disposer)
              (local_78.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pIVar2 = local_68.impl.ptr;
  if (local_68.impl.ptr != (Iface *)0x0) {
    local_68.impl.ptr = (Iface *)0x0;
    (**(local_68.impl.disposer)->_vptr_Disposer)
              (local_68.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  return;
}

Assistant:

void addGlobalOptions(kj::MainBuilder& builder) {
    builder.addOptionWithArg({'I', "import-path"}, KJ_BIND_METHOD(*this, addImportPath), "<dir>",
                             "Add <dir> to the list of directories searched for non-relative "
                             "imports (ones that start with a '/').")
           .addOption({"no-standard-import"}, KJ_BIND_METHOD(*this, noStandardImport),
                      "Do not add any default import paths; use only those specified by -I.  "
                      "Otherwise, typically /usr/include and /usr/local/include are added by "
                      "default.");
  }